

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O0

FT_Error FT_Stroker_EndSubPath(FT_Stroker stroker)

{
  FT_Error FVar1;
  FT_Angle FVar2;
  FT_Int inside_side;
  FT_Angle turn;
  FT_StrokeBorder right;
  FT_Error error;
  FT_Stroker stroker_local;
  
  right._4_4_ = 0;
  if (stroker == (FT_Stroker)0x0) {
    right._4_4_ = 6;
  }
  else if (stroker->subpath_open == '\0') {
    if ((((stroker->center).x == (stroker->subpath_start).x) &&
        ((stroker->center).y == (stroker->subpath_start).y)) ||
       (right._4_4_ = FT_Stroker_LineTo(stroker,&stroker->subpath_start), right._4_4_ == 0)) {
      stroker->angle_out = stroker->subpath_angle;
      FVar2 = FT_Angle_Diff(stroker->angle_in,stroker->angle_out);
      if (FVar2 != 0) {
        FVar1 = ft_stroker_inside(stroker,(uint)(FVar2 < 0),stroker->subpath_line_length);
        if (FVar1 != 0) {
          return FVar1;
        }
        right._4_4_ = ft_stroker_outside(stroker,(uint)((FVar2 < 0 != 0 ^ 0xffU) & 1),
                                         stroker->subpath_line_length);
        if (right._4_4_ != 0) {
          return right._4_4_;
        }
      }
      ft_stroke_border_close(stroker->borders,'\0');
      ft_stroke_border_close(stroker->borders + 1,'\x01');
    }
  }
  else {
    right._4_4_ = ft_stroker_cap(stroker,stroker->angle_in,0);
    if ((right._4_4_ == 0) &&
       (right._4_4_ = ft_stroker_add_reverse_left(stroker,'\x01'), right._4_4_ == 0)) {
      (stroker->center).x = (stroker->subpath_start).x;
      (stroker->center).y = (stroker->subpath_start).y;
      right._4_4_ = ft_stroker_cap(stroker,stroker->subpath_angle + 0xb40000,0);
      if (right._4_4_ == 0) {
        ft_stroke_border_close(stroker->borders,'\0');
      }
    }
  }
  return right._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Stroker_EndSubPath( FT_Stroker  stroker )
  {
    FT_Error  error = FT_Err_Ok;


    if ( !stroker )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    if ( stroker->subpath_open )
    {
      FT_StrokeBorder  right = stroker->borders;


      /* All right, this is an opened path, we need to add a cap between */
      /* right & left, add the reverse of left, then add a final cap     */
      /* between left & right.                                           */
      error = ft_stroker_cap( stroker, stroker->angle_in, 0 );
      if ( error )
        goto Exit;

      /* add reversed points from `left' to `right' */
      error = ft_stroker_add_reverse_left( stroker, TRUE );
      if ( error )
        goto Exit;

      /* now add the final cap */
      stroker->center = stroker->subpath_start;
      error = ft_stroker_cap( stroker,
                              stroker->subpath_angle + FT_ANGLE_PI, 0 );
      if ( error )
        goto Exit;

      /* Now end the right subpath accordingly.  The left one is */
      /* rewind and doesn't need further processing.             */
      ft_stroke_border_close( right, FALSE );
    }
    else
    {
      FT_Angle  turn;
      FT_Int    inside_side;


      /* close the path if needed */
      if ( stroker->center.x != stroker->subpath_start.x ||
           stroker->center.y != stroker->subpath_start.y )
      {
         error = FT_Stroker_LineTo( stroker, &stroker->subpath_start );
         if ( error )
           goto Exit;
      }

      /* process the corner */
      stroker->angle_out = stroker->subpath_angle;
      turn               = FT_Angle_Diff( stroker->angle_in,
                                          stroker->angle_out );

      /* no specific corner processing is required if the turn is 0 */
      if ( turn != 0 )
      {
        /* when we turn to the right, the inside side is 0 */
        /* otherwise, the inside side is 1 */
        inside_side = ( turn < 0 );

        error = ft_stroker_inside( stroker,
                                   inside_side,
                                   stroker->subpath_line_length );
        if ( error )
          goto Exit;

        /* process the outside side */
        error = ft_stroker_outside( stroker,
                                    !inside_side,
                                    stroker->subpath_line_length );
        if ( error )
          goto Exit;
      }

      /* then end our two subpaths */
      ft_stroke_border_close( stroker->borders + 0, FALSE );
      ft_stroke_border_close( stroker->borders + 1, TRUE );
    }

  Exit:
    return error;
  }